

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
ImageT<unsigned_char,_3U>::resample
          (ImageT<unsigned_char,_3U> *this,uint32_t targetWidth,uint32_t targetHeight,char *filter,
          float filterScale,Boundary_Op wrapMode)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  Color *pCVar4;
  void *pvVar5;
  _Head_base<0UL,_Image_*,_false> _Var6;
  char cVar7;
  uchar uVar8;
  ImageT<unsigned_char,_3U> *this_00;
  Resampler *this_01;
  float *pfVar9;
  runtime_error *this_02;
  uint uVar10;
  Contrib_List *pCVar11;
  byte *pbVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  char *pFilter;
  Boundary_Op BVar16;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  uint32_t c;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  Contrib_List *pCVar20;
  unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *this_03;
  TransferFunctionSRGB *pTVar21;
  pointer __p;
  undefined4 extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  string_view fmt;
  format_args args;
  int local_110;
  array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_3UL> resamplers
  ;
  array<const_float_*,_3UL> outputLine;
  _Head_base<0UL,_Image_*,_false> a_Stack_a0 [2];
  ulong local_90;
  array<std::vector<float,_std::allocator<float>_>,_3UL> samples;
  TransferFunctionLinear tfLinear;
  TransferFunctionSRGB tfSRGB;
  
  pFilter = (char *)CONCAT44(in_register_00000084,wrapMode);
  lVar13 = CONCAT44(in_register_00000034,targetWidth);
  BVar16 = in_R9._0_4_;
  this_00 = (ImageT<unsigned_char,_3U> *)operator_new(0x28);
  uVar10 = (uint)filter;
  ImageT(this_00,targetHeight,uVar10);
  uVar3 = *(undefined8 *)(lVar13 + 0x10);
  (this_00->super_Image).transferFunction = (int)uVar3;
  (this_00->super_Image).primaries = (int)((ulong)uVar3 >> 0x20);
  a_Stack_a0[1]._M_head_impl = &this->super_Image;
  if ((((uVar10 == 0) || (targetHeight == 0)) || (uVar1 = *(uint *)(lVar13 + 8), uVar1 == 0)) ||
     (uVar2 = *(uint *)(lVar13 + 0xc), uVar2 == 0)) {
    __assert_fail("sourceWidth && sourceHeight && targetWidth && targetHeight",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x461,
                  "virtual std::unique_ptr<Image> ImageT<unsigned char, 3>::resample(uint32_t, uint32_t, const char *, float, basisu::Resampler::Boundary_Op) [componentType = unsigned char, componentCount = 3]"
                 );
  }
  uVar14 = uVar2;
  if (uVar2 < uVar1) {
    uVar14 = uVar1;
  }
  uVar15 = uVar10;
  if (uVar10 < targetHeight) {
    uVar15 = targetHeight;
  }
  if ((uVar15 < 0x4001) && (uVar14 < 0x4001)) {
    samples._M_elems[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    samples._M_elems[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    samples._M_elems[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    samples._M_elems[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    samples._M_elems[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    samples._M_elems[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    samples._M_elems[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    samples._M_elems[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar17 = 0;
    samples._M_elems[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_03 = resamplers._M_elems;
    resamplers._M_elems[2]._M_t.
    super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>._M_t.
    super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
    super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
         (__uniq_ptr_data<basisu::Resampler,_std::default_delete<basisu::Resampler>,_true,_true>)
         (__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>)0x0;
    resamplers._M_elems[0]._M_t.
    super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>._M_t.
    super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
    super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
         (__uniq_ptr_data<basisu::Resampler,_std::default_delete<basisu::Resampler>,_true,_true>)
         (__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>)0x0;
    resamplers._M_elems[1]._M_t.
    super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>._M_t.
    super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
    super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
         (__uniq_ptr_data<basisu::Resampler,_std::default_delete<basisu::Resampler>,_true,_true>)
         (__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>)0x0;
    do {
      if (lVar17 == 0) {
        pCVar11 = (Contrib_List *)0x0;
        pCVar20 = (Contrib_List *)0x0;
      }
      else {
        pCVar11 = *(Contrib_List **)
                   ((long)resamplers._M_elems[0]._M_t.
                          super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                          .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl + 0x30);
        pCVar20 = *(Contrib_List **)
                   ((long)resamplers._M_elems[0]._M_t.
                          super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                          .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl + 0x38);
      }
      this_01 = (Resampler *)operator_new(0x78);
      basisu::Resampler::Resampler
                (this_01,uVar1,uVar2,targetHeight,uVar10,BVar16,0.0,1.0,pFilter,pCVar11,pCVar20,
                 filterScale,filterScale,0.0,0.0);
      outputLine._M_elems[0] = (float *)0x0;
      std::__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::reset
                ((__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                 this_03,this_01);
      std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::~unique_ptr
                ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                 &outputLine);
      checkResamplerStatus
                ((((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                  &this_03->_M_t)->_M_t).
                 super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                 .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl,pFilter);
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)
                 ((long)&samples._M_elems[0].super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar17),(ulong)uVar1);
      this_03 = this_03 + 1;
      lVar17 = lVar17 + 0x18;
    } while (lVar17 != 0x48);
    tfSRGB.super_TransferFunction._vptr_TransferFunction = (TransferFunction)&PTR_encode_001b28d8;
    tfLinear.super_TransferFunction._vptr_TransferFunction = (TransferFunction)&PTR_encode_001b2930;
    pTVar21 = (TransferFunctionSRGB *)&tfLinear;
    if (*(int *)(lVar13 + 0x10) == 2) {
      pTVar21 = &tfSRGB;
    }
    uVar19 = 0;
    local_110 = 0;
    uVar10 = 0;
    do {
      local_90 = uVar19;
      uVar18 = 0;
      do {
        pbVar12 = (byte *)(uVar19 * 3 + *(long *)(lVar13 + 0x18));
        lVar17 = 0;
        do {
          (*(pTVar21->super_TransferFunction)._vptr_TransferFunction[1])
                    ((float)*pbVar12 * 0.003921569,pTVar21);
          *(undefined4 *)
           (*(long *)((long)&samples._M_elems[0].super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar17) + uVar18 * 4) =
               extraout_XMM0_Da;
          pbVar12 = pbVar12 + 1;
          lVar17 = lVar17 + 0x18;
        } while (lVar17 != 0x48);
        uVar18 = uVar18 + 1;
        uVar19 = (ulong)((int)uVar19 + 1);
      } while (uVar18 != uVar1);
      lVar17 = 0;
      do {
        cVar7 = basisu::Resampler::put_line
                          ((float *)resamplers._M_elems[lVar17]._M_t.
                                    super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                                    .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl)
        ;
        if (cVar7 == '\0') {
          checkResamplerStatus
                    (resamplers._M_elems[lVar17]._M_t.
                     super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                     .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl,pFilter);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      uVar14 = targetHeight * local_110;
      while( true ) {
        outputLine._M_elems[0] = (float *)0x0;
        outputLine._M_elems[1] = (float *)0x0;
        outputLine._M_elems[2] = (float *)0x0;
        lVar17 = 0;
        do {
          pfVar9 = (float *)basisu::Resampler::get_line();
          _Var6._M_head_impl = a_Stack_a0[1]._M_head_impl;
          outputLine._M_elems[lVar17] = pfVar9;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 3);
        if (outputLine._M_elems[0] == (float *)0x0) break;
        uVar19 = 0;
        uVar15 = uVar14;
        do {
          pCVar4 = this_00->pixels;
          lVar17 = 0;
          do {
            (**(pTVar21->super_TransferFunction)._vptr_TransferFunction)
                      (outputLine._M_elems[lVar17][uVar19],pTVar21);
            if (0.0 <= extraout_XMM0_Da_00) {
              uVar8 = 0xff;
              if (extraout_XMM0_Da_00 <= 1.0) {
                uVar8 = (uchar)(int)(extraout_XMM0_Da_00 * 255.0 + 0.5);
              }
            }
            else {
              uVar8 = '\0';
            }
            pCVar4[uVar15].field_0.comps[lVar17] = uVar8;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          uVar19 = uVar19 + 1;
          uVar15 = uVar15 + 1;
        } while (uVar19 != targetHeight);
        local_110 = local_110 + 1;
        uVar14 = uVar14 + targetHeight;
      }
      uVar10 = uVar10 + 1;
      uVar19 = (ulong)((int)local_90 + uVar1);
    } while (uVar10 != uVar2);
    (a_Stack_a0[1]._M_head_impl)->_vptr_Image = (_func_int **)this_00;
    lVar13 = 0x10;
    do {
      std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::~unique_ptr
                ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                 ((long)&resamplers._M_elems[0]._M_t.
                         super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                         .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl + lVar13));
      lVar13 = lVar13 + -8;
    } while (lVar13 != -8);
    lVar13 = 0x48;
    do {
      pvVar5 = *(void **)((long)&a_Stack_a0[0]._M_head_impl + lVar13);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,*(long *)((long)&(&samples)[-1]._M_elems[2].
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage +
                                        lVar13) - (long)pvVar5);
      }
      lVar13 = lVar13 + -0x18;
    } while (lVar13 != 0);
    return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
           (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)_Var6._M_head_impl;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  resamplers._M_elems[0]._M_t.
  super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>._M_t.
  super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
  super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
       (__uniq_ptr_data<basisu::Resampler,_std::default_delete<basisu::Resampler>,_true,_true>)
       (__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>)0x4000;
  fmt.size_ = 1;
  fmt.data_ = (char *)0x2a;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&resamplers;
  ::fmt::v10::vformat_abi_cxx11_
            ((string *)&samples,(v10 *)"Image larger than max supported size of {}",fmt,args);
  std::runtime_error::runtime_error(this_02,(string *)&samples);
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual std::unique_ptr<Image> resample(uint32_t targetWidth, uint32_t targetHeight,
            const char* filter, float filterScale, basisu::Resampler::Boundary_Op wrapMode) override {
        using namespace basisu;

        auto target = std::make_unique<ImageT<componentType, componentCount>>(targetWidth, targetHeight);
        target->setTransferFunction(transferFunction);
        target->setPrimaries(primaries);

        const auto sourceWidth = width;
        const auto sourceHeight = height;
        assert(sourceWidth && sourceHeight && targetWidth && targetHeight);

        if (std::max(sourceWidth, sourceHeight) > BASISU_RESAMPLER_MAX_DIMENSION ||
                std::max(targetWidth, targetHeight) > BASISU_RESAMPLER_MAX_DIMENSION) {
            throw std::runtime_error(fmt::format(
                    "Image larger than max supported size of {}", BASISU_RESAMPLER_MAX_DIMENSION));
        }

        std::array<std::vector<float>, componentCount> samples;
        std::array<std::unique_ptr<Resampler>, componentCount> resamplers;

        // Float types handled as SFloat HDR otherwise UNROM LDR is assumed
        const auto isHDR = std::is_floating_point_v<componentType>;

        for (uint32_t i = 0; i < componentCount; ++i) {
            resamplers[i] = std::make_unique<Resampler>(
                    sourceWidth, sourceHeight,
                    targetWidth, targetHeight,
                    wrapMode,
                    0.0f, isHDR ? 0.0f : 1.0f,
                    filter,
                    i == 0 ? nullptr : resamplers[0]->get_clist_x(),
                    i == 0 ? nullptr : resamplers[0]->get_clist_y(),
                    filterScale, filterScale,
                    0.f, 0.f);
            checkResamplerStatus(*resamplers[i], filter);
            samples[i].resize(sourceWidth);
        }

        const TransferFunctionSRGB tfSRGB;
        const TransferFunctionLinear tfLinear;
        const TransferFunction& tf = transferFunction == KHR_DF_TRANSFER_SRGB ?
                static_cast<const TransferFunction&>(tfSRGB) :
                static_cast<const TransferFunction&>(tfLinear);

        uint32_t targetY = 0;
        for (uint32_t sourceY = 0; sourceY < sourceHeight; ++sourceY) {
            // Put source lines into resampler(s)
            for (uint32_t sourceX = 0; sourceX < sourceWidth; ++sourceX) {
                const auto& sourcePixel = pixels[sourceY * sourceWidth + sourceX];
                for (uint32_t c = 0; c < componentCount; ++c) {
                    const float value = std::is_floating_point_v<componentType> ?
                            sourcePixel[c] :
                            static_cast<float>(sourcePixel[c]) * (1.f / static_cast<float>(Color::one()));

                    // c == 3: Alpha channel always uses tfLinear
                    samples[c][sourceX] = (c == 3 ? tfLinear : tf).decode(value);
                }
            }

            for (uint32_t c = 0; c < componentCount; ++c)
                if (!resamplers[c]->put_line(&samples[c][0]))
                    checkResamplerStatus(*resamplers[c], filter);

            // Retrieve any output lines
            while (true) {
                std::array<const float*, componentCount> outputLine{nullptr};
                for (uint32_t c = 0; c < componentCount; ++c)
                    outputLine[c] = resamplers[c]->get_line();

                if (outputLine[0] == nullptr)
                    break; // No new output line, break from retrieve and place in a new source line

                for (uint32_t targetX = 0; targetX < targetWidth; ++targetX) {
                    Color& targetPixel = target->pixels[targetY * targetWidth + targetX];
                    for (uint32_t c = 0; c < componentCount; ++c) {
                        const auto linearValue = outputLine[c][targetX];

                        // c == 3: Alpha channel always uses tfLinear
                        const float outValue = (c == 3 ? tfLinear : tf).encode(linearValue);
                        if constexpr (std::is_floating_point_v<componentType>) {
                            targetPixel[c] = outValue;
                        } else {
                            const auto unormValue =
                                std::isnan(outValue) ? componentType{0} :
                                outValue < 0.f ? componentType{0} :
                                outValue > 1.f ? Color::one() :
                                static_cast<componentType>(outValue * static_cast<float>(Color::one()) + 0.5f);
                            targetPixel[c] = unormValue;
                        }
                    }
                }

                ++targetY;
            }
        }

        return target;
    }